

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxpmhandler.cpp
# Opt level: O1

bool read_xpm_string(QByteArray *buf,QIODevice *d,char **source,int *index,QByteArray *state)

{
  QArrayData *pQVar1;
  char *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long in_FS_OFFSET;
  char buf_1 [2048];
  QByteArray local_858;
  char local_838 [2048];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (source == (char **)0x0) {
    QByteArray::operator=(buf,"");
    iVar7 = 0;
    bVar4 = false;
    while( true ) {
      while( true ) {
        lVar5 = (state->d).size;
        iVar6 = iVar7;
        if (lVar5 == iVar7 || lVar5 == 0) {
          memset(local_838,0xaa,0x800);
          lVar5 = QIODevice::read((char *)d,(longlong)local_838);
          if (0 < lVar5) {
            QByteArray::QByteArray(&local_858,local_838,(long)(int)lVar5);
            pQVar1 = &((state->d).d)->super_QArrayData;
            pcVar2 = (state->d).ptr;
            *(undefined4 *)&(state->d).d = local_858.d.d._0_4_;
            *(undefined4 *)((long)&(state->d).d + 4) = local_858.d.d._4_4_;
            *(undefined4 *)&(state->d).ptr = local_858.d.ptr._0_4_;
            *(undefined4 *)((long)&(state->d).ptr + 4) = local_858.d.ptr._4_4_;
            qVar3 = (state->d).size;
            (state->d).size = local_858.d.size;
            local_858.d.d = (Data *)pQVar1;
            local_858.d.ptr = pcVar2;
            local_858.d.size = qVar3;
            if (pQVar1 != (QArrayData *)0x0) {
              LOCK();
              (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar1,1,0x10);
              }
            }
            iVar6 = 0;
          }
          if (lVar5 < 1) {
            bVar4 = false;
            goto LAB_002bd97d;
          }
        }
        iVar7 = iVar6 + 1;
        if (bVar4) break;
        if ((state->d).ptr[iVar6] == '\"') {
          bVar4 = true;
        }
      }
      if ((state->d).ptr[iVar6] == '\"') break;
      QByteArray::append((char)buf);
    }
    QByteArray::remove((longlong)state,0);
  }
  else {
    iVar7 = *index;
    *index = iVar7 + 1;
    QByteArray::operator=(buf,source[iVar7]);
  }
  bVar4 = true;
LAB_002bd97d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

static bool read_xpm_string(QByteArray &buf, QIODevice *d, const char * const *source, int &index,
                            QByteArray &state)
{
    if (source) {
        buf = source[index++];
        return true;
    }

    buf = "";
    bool gotQuote = false;
    int offset = 0;
    forever {
        if (offset == state.size() || state.isEmpty()) {
            char buf[2048];
            qint64 bytesRead = d->read(buf, sizeof(buf));
            if (bytesRead <= 0)
                return false;
            state = QByteArray(buf, int(bytesRead));
            offset = 0;
        }

        if (!gotQuote) {
            if (state.at(offset++) == '"')
                gotQuote = true;
        } else {
            char c = state.at(offset++);
            if (c == '"')
                break;
            buf += c;
        }
    }
    state.remove(0, offset);
    return true;
}